

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_reporter_tests.c
# Opt level: O0

TestSuite * cute_reporter_tests(void)

{
  TestSuite *pTVar1;
  TestSuite *suite;
  
  pTVar1 = (TestSuite *)
           create_named_test_suite_
                     ("cute_reporter_tests",
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cute_reporter_tests.c"
                      ,0xc3);
  set_setup(pTVar1,setup_cute_reporter_tests);
  add_test_(pTVar1,"will_report_beginning_of_suite",
            &CgreenSpec__CuteReporter__will_report_beginning_of_suite__);
  add_test_(pTVar1,"will_report_beginning_and_successful_finishing_of_test",
            &CgreenSpec__CuteReporter__will_report_beginning_and_successful_finishing_of_test__);
  add_test_(pTVar1,"will_report_failing_of_test_only_once",
            &CgreenSpec__CuteReporter__will_report_failing_of_test_only_once__);
  add_test_(pTVar1,"will_report_finishing_of_suite",
            &CgreenSpec__CuteReporter__will_report_finishing_of_suite__);
  add_test_(pTVar1,"will_report_non_finishing_test",
            &CgreenSpec__CuteReporter__will_report_non_finishing_test__);
  set_teardown(pTVar1,teardown_cute_reporter_tests);
  return pTVar1;
}

Assistant:

TestSuite *cute_reporter_tests(void) {
    TestSuite *suite = create_test_suite();
    set_setup(suite, setup_cute_reporter_tests);

    add_test_with_context(suite, CuteReporter, will_report_beginning_of_suite);
    add_test_with_context(suite, CuteReporter, will_report_beginning_and_successful_finishing_of_test);
    add_test_with_context(suite, CuteReporter, will_report_failing_of_test_only_once);
    add_test_with_context(suite, CuteReporter, will_report_finishing_of_suite);
    add_test_with_context(suite, CuteReporter, will_report_non_finishing_test);

    set_teardown(suite, teardown_cute_reporter_tests);
    return suite;
}